

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O1

void nhr_request_connect_to_host(nhr_request r)

{
  addrinfo **ppaVar1;
  uint uVar2;
  nhr_bool nVar3;
  int __fd;
  int iVar4;
  time_t tVar5;
  addrinfo *paVar6;
  undefined4 local_48;
  undefined4 local_44;
  ulong local_40;
  addrinfo *local_38;
  
  tVar5 = time((time_t *)0x0);
  r->last_time = tVar5;
  paVar6 = nhr_request_connect_getaddr_info(r);
  nVar3 = nhr_request_check_timeout(r);
  if (paVar6 != (addrinfo *)0x0 && nVar3 != '\0') {
    local_40 = 1;
    local_38 = paVar6;
LAB_00106794:
    do {
      tVar5 = time((time_t *)0x0);
      r->last_time = tVar5;
      __fd = socket(paVar6->ai_family,paVar6->ai_socktype,paVar6->ai_protocol);
      if (__fd == -1) {
LAB_0010680e:
        nVar3 = nhr_request_check_timeout(r);
        if (nVar3 == '\0') {
          return;
        }
        ppaVar1 = &paVar6->ai_next;
        paVar6 = *ppaVar1;
        if (*ppaVar1 != (addrinfo *)0x0) goto LAB_00106794;
      }
      else {
        local_48 = 1;
        setsockopt(__fd,1,4,&local_48,4);
        local_44 = 1;
        setsockopt(__fd,1,9,&local_44,4);
        iVar4 = connect(__fd,(sockaddr *)paVar6->ai_addr,paVar6->ai_addrlen);
        if (iVar4 != 0) {
          close(__fd);
          goto LAB_0010680e;
        }
        r->socket = __fd;
        fcntl(__fd,4,0x800);
      }
      if (__fd != -1) break;
      nhr_thread_sleep(200);
      uVar2 = (uint)local_40;
      local_40 = (ulong)(uVar2 + 1);
      paVar6 = local_38;
    } while (uVar2 < 4);
    freeaddrinfo((addrinfo *)local_38);
    if (r->socket == -1) {
      r->error_code = nhr_error_code_failed_connect_to_host;
      nhr_request_set_command(r,6);
    }
    else {
      nhr_mutex_lock(r->command_mutex);
      r->command = 2;
      nhr_mutex_unlock(r->command_mutex);
    }
  }
  return;
}

Assistant:

void nhr_request_connect_to_host(nhr_request r) {
	struct addrinfo * result = NULL;
	struct addrinfo * p = NULL;
	nhr_socket_t sock = NHR_INVALID_SOCKET;
	int retry_number = 0;
#if defined(NHR_OS_WINDOWS)
	unsigned long iMode = 0;
#endif

	r->last_time = time(NULL);
	result = nhr_request_connect_getaddr_info(r);
	if (!nhr_request_check_timeout(r)) {
		return; // error already exists
	}
	if (!result) {
		return; // error already exists
	}

	while ((++retry_number < NHR_CONNECT_ATTEMPS) && (sock == NHR_INVALID_SOCKET)) {
		for (p = result; p != NULL; p = p->ai_next) {
			r->last_time = time(NULL);
			sock = socket(p->ai_family, p->ai_socktype, p->ai_protocol);
			if (sock != NHR_INVALID_SOCKET) {
				nhr_request_set_option(sock, SO_ERROR, 1); // When an error occurs on a socket, set error variable so_error and notify process
				nhr_request_set_option(sock, SO_KEEPALIVE, 1); // Periodically test if connection is alive

				if (connect(sock, p->ai_addr, p->ai_addrlen) == 0) {
					r->socket = sock;
#if defined(NHR_OS_WINDOWS)
					iMode = 1; // If iMode != 0, non-blocking mode is enabled.
					ioctlsocket(r->socket, FIONBIO, &iMode);
#else
					fcntl(r->socket, F_SETFL, O_NONBLOCK);
#endif
					break;
				}
				NHR_SOCK_CLOSE(sock);
			}
			if (!nhr_request_check_timeout(r)) {
				return; // error already exists
			}
		}
		if (sock == NHR_INVALID_SOCKET) {
			nhr_thread_sleep(NHR_CONNECT_RETRY_DELAY);
		}
	}

	freeaddrinfo(result);

	if (r->socket == NHR_INVALID_SOCKET) {
#if defined(NHR_OS_WINDOWS)
		WSACleanup();
#endif
		r->error_code = nhr_error_code_failed_connect_to_host;
		nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
	} else {
		nhr_request_set_command(r, NHR_COMMAND_SEND_RAW_REQUEST);
	}
}